

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

void zlib_message(zlib *zlib,int unexpected)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  char *local_20;
  char *reason;
  int unexpected_local;
  zlib *zlib_local;
  
  if ((undefined1  [96])((undefined1  [96])*zlib->global & (undefined1  [96])0x1) !=
      (undefined1  [96])0x0) {
    local_20 = (zlib->z).msg;
    if (local_20 == (char *)0x0) {
      local_20 = "[no message]";
    }
    fputs(zlib->file->file_name,_stderr);
    type_sep((FILE *)_stderr);
    type_name(zlib->chunk->chunk_type,(FILE *)_stderr);
    __stream = _stderr;
    pcVar2 = "";
    if (unexpected != 0) {
      pcVar2 = "unexpected ";
    }
    uVar1 = zlib->rc;
    pcVar3 = zlib_rc(zlib);
    fprintf(__stream,": %szlib error: %d (%s) (%s)\n",pcVar2,(ulong)uVar1,pcVar3,local_20);
  }
  return;
}

Assistant:

static void
zlib_message(struct zlib *zlib, int unexpected)
   /* Output a message given a zlib rc */
{
   if (zlib->global->errors)
   {
      const char *reason = zlib->z.msg;

      if (reason == NULL)
         reason = "[no message]";

      fputs(zlib->file->file_name, stderr);
      type_sep(stderr);
      type_name(zlib->chunk->chunk_type, stderr);
      fprintf(stderr, ": %szlib error: %d (%s) (%s)\n",
         unexpected ? "unexpected " : "", zlib->rc, zlib_rc(zlib), reason);
   }
}